

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>::
truncate(ArrayBuilder<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
         *this,char *__file,__off_t __length)

{
  Entry *pEVar1;
  Entry *pEVar2;
  Entry *pEVar3;
  ReadableDirectory *pRVar4;
  Disposer *pDVar5;
  String *pSVar6;
  size_t sVar7;
  ArrayDisposer *pAVar8;
  int in_EAX;
  
  pEVar2 = this->ptr;
  pEVar3 = this->pos;
  while (pEVar2 + (long)__file < pEVar3) {
    pEVar1 = pEVar3 + -1;
    this->pos = pEVar1;
    pRVar4 = pEVar3[-1].value.dir.ptr;
    if (pRVar4 != (ReadableDirectory *)0x0) {
      pEVar3[-1].value.dir.ptr = (ReadableDirectory *)0x0;
      pDVar5 = pEVar3[-1].value.dir.disposer;
      in_EAX = (**pDVar5->_vptr_Disposer)
                         (pDVar5,(pRVar4->super_FsNode)._vptr_FsNode[-2] +
                                 (long)&(pRVar4->super_FsNode)._vptr_FsNode);
    }
    pSVar6 = (pEVar1->key).parts.ptr;
    if (pSVar6 != (String *)0x0) {
      sVar7 = pEVar3[-1].key.parts.size_;
      (pEVar1->key).parts.ptr = (String *)0x0;
      pEVar3[-1].key.parts.size_ = 0;
      pAVar8 = pEVar3[-1].key.parts.disposer;
      in_EAX = (**pAVar8->_vptr_ArrayDisposer)
                         (pAVar8,pSVar6,0x18,sVar7,sVar7,
                          ArrayDisposer::Dispose_<kj::String,_false>::destruct);
    }
    pEVar3 = this->pos;
  }
  return in_EAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }